

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::getInfo1
          (btGeneric6DofSpring2Constraint *this,btConstraintInfo1 *info)

{
  btGeneric6DofSpring2Constraint *this_00;
  int *in_RSI;
  long in_RDI;
  int i;
  btTransform *in_stack_00000070;
  btTransform *in_stack_00000078;
  btGeneric6DofSpring2Constraint *in_stack_00000080;
  int local_14;
  
  this_00 = (btGeneric6DofSpring2Constraint *)
            btRigidBody::getCenterOfMassTransform(*(btRigidBody **)(in_RDI + 0x28));
  btRigidBody::getCenterOfMassTransform(*(btRigidBody **)(in_RDI + 0x30));
  calculateTransforms(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  *in_RSI = 0;
  in_RSI[1] = 0;
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    if (*(int *)(in_RDI + 0x3d4 + (long)local_14 * 4) == 4) {
      *in_RSI = *in_RSI + 2;
    }
    else if (*(int *)(in_RDI + 0x3d4 + (long)local_14 * 4) != 0) {
      *in_RSI = *in_RSI + 1;
    }
    if ((*(byte *)(in_RDI + 0x330 + (long)local_14) & 1) != 0) {
      *in_RSI = *in_RSI + 1;
    }
    if ((*(byte *)(in_RDI + 0x336 + (long)local_14) & 1) != 0) {
      *in_RSI = *in_RSI + 1;
    }
  }
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    testAngularLimitMotor(this_00,(int)((ulong)in_RDI >> 0x20));
    if (*(int *)(in_RDI + (long)local_14 * 0x58 + 0x434) == 4) {
      *in_RSI = *in_RSI + 2;
    }
    else if (*(int *)(in_RDI + (long)local_14 * 0x58 + 0x434) != 0) {
      *in_RSI = *in_RSI + 1;
    }
    if ((*(byte *)(in_RDI + (long)local_14 * 0x58 + 0x3fc) & 1) != 0) {
      *in_RSI = *in_RSI + 1;
    }
    if ((*(byte *)(in_RDI + (long)local_14 * 0x58 + 0x410) & 1) != 0) {
      *in_RSI = *in_RSI + 1;
    }
  }
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::getInfo1 (btConstraintInfo1* info)
{
	//prepare constraint
	calculateTransforms(m_rbA.getCenterOfMassTransform(),m_rbB.getCenterOfMassTransform());
	info->m_numConstraintRows = 0;
	info->nub = 0;
	int i;
	//test linear limits
	for(i = 0; i < 3; i++)
	{
		     if (m_linearLimits.m_currentLimit[i]==4) info->m_numConstraintRows += 2;
		else if (m_linearLimits.m_currentLimit[i]!=0) info->m_numConstraintRows += 1;
		if (m_linearLimits.m_enableMotor[i] ) info->m_numConstraintRows += 1;
		if (m_linearLimits.m_enableSpring[i]) info->m_numConstraintRows += 1;
	}
	//test angular limits
	for (i=0;i<3 ;i++ )
	{
		testAngularLimitMotor(i);
		     if (m_angularLimits[i].m_currentLimit==4) info->m_numConstraintRows += 2;
		else if (m_angularLimits[i].m_currentLimit!=0) info->m_numConstraintRows += 1;
		if (m_angularLimits[i].m_enableMotor ) info->m_numConstraintRows += 1;
		if (m_angularLimits[i].m_enableSpring) info->m_numConstraintRows += 1;
	}
}